

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void google::protobuf::internal::WriteVarint(uint32 num,uint64 val,string *s)

{
  WriteVarint((ulong)(num << 3),s);
  WriteVarint(val,s);
  return;
}

Assistant:

void WriteVarint(uint32 num, uint64 val, std::string* s) {
  WriteVarint(num << 3, s);
  WriteVarint(val, s);
}